

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.hpp
# Opt level: O1

hash_t __thiscall duckdb::Hash<duckdb::uhugeint_t>(duckdb *this,uhugeint_t val)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = ((ulong)this >> 0x20 ^ (ulong)this) * -0x2917014799a6026d;
  uVar2 = (val.lower >> 0x20 ^ val.lower) * -0x2917014799a6026d;
  uVar1 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d ^
          (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

inline hash_t MurmurHash64(uint64_t x) {
	x ^= x >> 32;
	x *= 0xd6e8feb86659fd93U;
	x ^= x >> 32;
	x *= 0xd6e8feb86659fd93U;
	x ^= x >> 32;
	return x;
}